

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O2

int datatype_elems(Context_conflict *ctx,MOJOSHADER_astDataType *dt)

{
  MOJOSHADER_astDataType *pMVar1;
  int iVar2;
  
  pMVar1 = reduce_datatype(ctx,dt);
  if (pMVar1->type == MOJOSHADER_AST_DATATYPE_MATRIX) {
    iVar2 = (pMVar1->matrix).columns * (pMVar1->array).elements;
  }
  else if (pMVar1->type == MOJOSHADER_AST_DATATYPE_VECTOR) {
    iVar2 = (pMVar1->array).elements;
  }
  else {
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int datatype_elems(Context *ctx, const MOJOSHADER_astDataType *dt)
{
    dt = reduce_datatype(ctx, dt);
    switch (dt->type)
    {
        case MOJOSHADER_AST_DATATYPE_VECTOR:
            return dt->vector.elements;
        case MOJOSHADER_AST_DATATYPE_MATRIX:
            return dt->matrix.rows * dt->matrix.columns;
        default:
            return 1;
    } // switch
}